

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.cpp
# Opt level: O2

void __thiscall Lz77Encoder::run(Lz77Encoder *this)

{
  value_type vVar1;
  char cVar2;
  char cVar3;
  pointer pLVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  Lz77Node *node;
  pointer pLVar10;
  int iVar11;
  int iVar12;
  value_type symbol;
  uint local_268;
  int amount;
  string *local_260;
  int shift;
  int local_254;
  ulong local_250;
  vector<Lz77Node,_std::allocator<Lz77Node>_> table;
  long local_218 [4];
  string local_1f8 [32];
  long local_1d8 [4];
  stringstream out;
  ulong local_1b0;
  ostream local_1a8 [376];
  
  poVar5 = std::operator<<((ostream *)&std::cout,"LZ77 encryption...");
  std::endl<char,std::char_traits<char>>(poVar5);
  table.super__Vector_base<Lz77Node,_std::allocator<Lz77Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  table.super__Vector_base<Lz77Node,_std::allocator<Lz77Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  table.super__Vector_base<Lz77Node,_std::allocator<Lz77Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_260 = (string *)&(this->super_Cryptor).in_message_;
  local_268 = 0;
  do {
    std::__cxx11::string::string((string *)&out,local_260);
    uVar7 = (ulong)local_268;
    std::__cxx11::string::~string((string *)&out);
    if (local_1b0 <= uVar7) {
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      pLVar4 = table.super__Vector_base<Lz77Node,_std::allocator<Lz77Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pLVar10 = table.super__Vector_base<Lz77Node,_std::allocator<Lz77Node>_>._M_impl.
                     super__Vector_impl_data._M_start; pLVar10 != pLVar4; pLVar10 = pLVar10 + 1) {
        if ((pLVar10->offset_ != 0) && (pLVar10->amount_ != 0)) {
          poVar5 = std::operator<<(local_1a8,'[');
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,pLVar10->offset_);
          poVar5 = std::operator<<(poVar5,',');
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,pLVar10->amount_);
          std::operator<<(poVar5,']');
          std::ostream::flush();
        }
        std::operator<<(local_1a8,pLVar10->symbol_);
        std::ostream::flush();
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      poVar5 = std::operator<<((ostream *)&std::cout,"encryption done!");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringstream::~stringstream((stringstream *)&out);
      std::_Vector_base<Lz77Node,_std::allocator<Lz77Node>_>::~_Vector_base
                (&table.super__Vector_base<Lz77Node,_std::allocator<Lz77Node>_>);
      return;
    }
    amount = 0;
    shift = 0;
    std::__cxx11::string::string((string *)&out,local_260);
    vVar1 = *(value_type *)(_out + uVar7);
    std::__cxx11::string::~string((string *)&out);
    uVar6 = (ulong)local_268;
    symbol = vVar1;
    do {
      iVar12 = (int)uVar7;
      local_254 = local_268 - iVar12;
      local_250 = uVar6 & 0xffffffff;
      lVar9 = 0;
      iVar11 = 0;
      while( true ) {
        std::__cxx11::string::string((string *)&out,local_260);
        uVar8 = (uint)lVar9;
        uVar6 = (ulong)((int)local_250 + uVar8);
        if (local_1b0 <= uVar6) break;
        std::__cxx11::string::string((string *)local_218,local_260);
        cVar2 = *(char *)(local_218[0] + uVar6);
        std::__cxx11::string::string((string *)local_1d8,local_260);
        cVar3 = *(char *)(lVar9 + local_1d8[0] + uVar7);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::string::~string((string *)local_218);
        std::__cxx11::string::~string((string *)&out);
        if ((cVar2 != cVar3) || (local_268 <= iVar12 + uVar8)) goto LAB_00109c8b;
        if (iVar11 == 0) {
          iVar11 = local_254;
        }
        lVar9 = lVar9 + 1;
      }
      std::__cxx11::string::~string((string *)&out);
LAB_00109c8b:
      uVar6 = (ulong)local_268;
      if (3 < uVar8 && amount < (int)uVar8) {
        uVar6 = local_250 + lVar9;
        amount = uVar8;
        shift = iVar11;
      }
      iVar11 = amount;
      uVar7 = uVar7 - 1;
    } while (iVar12 != 0);
    std::__cxx11::string::string((string *)&out,local_260);
    uVar8 = iVar11 + local_268;
    symbol = *(value_type *)(_out + (ulong)uVar8);
    std::__cxx11::string::~string((string *)&out);
    std::vector<Lz77Node,std::allocator<Lz77Node>>::emplace_back<char&,int&,int&>
              ((vector<Lz77Node,std::allocator<Lz77Node>> *)&table,&symbol,&shift,&amount);
    local_268 = uVar8 + 1;
  } while( true );
}

Assistant:

void Lz77Encoder::run() {
  cout << "LZ77 encryption..." << endl;

  //iterate through message & write it into table
  vector<Lz77Node> table;
  for (unsigned int i = 0; i < get_in_message().length(); i++) {

    //initial data
    auto amount = 0;
    auto shift = 0;
    auto initial_i = i;
    auto symbol = get_in_message()[i];

    //iterate through encoded sequence
    for (auto j = i; ; j--) {

      auto temp_amount = 0;
      auto temp_shift = 0;
      auto initial_j = j;

      while (initial_i < get_in_message().length() &&
        get_in_message()[initial_i] == get_in_message()[initial_j] &&
        initial_j < i) {

        initial_i++;
        initial_j++;
        temp_amount++;

        if (temp_shift == 0) {
          //relative offset
          temp_shift = i - j;
        }
      }

      //no reason to refer if repetition is less than 4 chars
      if (temp_amount > amount && temp_amount > 3) {
        amount = temp_amount;
        shift = temp_shift;
      }
      else {
        initial_i = i;
      }

      if (j == 0)
      {
        break;
      }
    }

    i += amount;
    symbol = get_in_message()[i];
    table.emplace_back(symbol, shift, amount);
  }

  stringstream out;
  for (auto& node : table) {
    if (node.get_offset() != 0 && node.get_amount() != 0) {
      out << LEFT_BREAK << node.get_offset() << SEPARATOR << node.get_amount() << RIGHT_BREAK << flush;
    }
    out << node.get_symbol() << flush;
  }
  set_out_message(out.str());

  cout << "encryption done!" << endl;
}